

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O2

BaseState<true> * __thiscall
DecisionServiceState<true>::Key
          (DecisionServiceState<true> *this,Context<true> *ctx,char *str,SizeType length,
          bool param_4)

{
  char cVar1;
  int iVar2;
  BaseState<true> *pBVar3;
  
  switch(length) {
  case 0:
    break;
  case 1:
    cVar1 = *str;
    if (cVar1 == 'p') {
      (ctx->array_float_state).output_array = &this->data->probabilities;
      return &(ctx->array_float_state).super_BaseState<true>;
    }
    if (cVar1 == 'c') {
      ctx->key = " ";
      ctx->key_length = 1;
      return &(ctx->default_state).super_BaseState<true>;
    }
    if (cVar1 == 'a') {
      (ctx->array_uint_state).output_array = &this->data->actions;
      return &(ctx->array_uint_state).super_BaseState<true>;
    }
    break;
  default:
    if (length < 6) break;
    goto LAB_001b4afa;
  case 5:
    iVar2 = strcmp(str,"pdrop");
    if (iVar2 == 0) {
      (ctx->float_state).output_float = &this->data->probabilityOfDrop;
      return &(ctx->float_state).super_BaseState<true>;
    }
    break;
  case 7:
    iVar2 = strcmp(str,"EventId");
    if (iVar2 == 0) {
      (ctx->string_state).output_string = &this->data->eventId;
      return &(ctx->string_state).super_BaseState<true>;
    }
LAB_001b4afa:
    if (*str == '_') {
      iVar2 = strncmp(str,"_label",6);
      if (iVar2 == 0) {
        ctx->key = str;
        ctx->key_length = length;
        if (length == 6) {
          pBVar3 = &(ctx->label_state).super_BaseState<true>;
        }
        else if (str[6] == '_') {
          pBVar3 = &(ctx->label_single_property_state).super_BaseState<true>;
        }
        else {
          if ((length != 0xb) || (iVar2 = strcasecmp(str,"_labelIndex"), iVar2 != 0)) break;
          pBVar3 = &(ctx->label_index_state).super_BaseState<true>;
        }
      }
      else {
        if ((length != 10) || (iVar2 = strncmp(str,"_skipLearn",10), iVar2 != 0)) break;
        (ctx->bool_state).output_bool = &this->data->skipLearn;
        pBVar3 = &(ctx->bool_state).super_BaseState<true>;
      }
      return pBVar3;
    }
  }
  pBVar3 = DefaultState<true>::Ignore(&ctx->default_state,ctx,length);
  return pBVar3;
}

Assistant:

BaseState<audit>* Key(Context<audit>& ctx, const char* str, rapidjson::SizeType length, bool /* copy */)
  {
    if (length == 1)
    {
      switch (str[0])
      {
        case 'a':
          ctx.array_uint_state.output_array = &data->actions;
          return &ctx.array_uint_state;
        case 'p':
          ctx.array_float_state.output_array = &data->probabilities;
          return &ctx.array_float_state;
        case 'c':
          ctx.key = " ";
          ctx.key_length = 1;
          return &ctx.default_state;
      }
    }
    else if (length == 5 && !strcmp(str, "pdrop"))
    {
      ctx.float_state.output_float = &data->probabilityOfDrop;
      return &ctx.float_state;
    }
    else if (length == 7 && !strcmp(str, "EventId"))
    {
      ctx.string_state.output_string = &data->eventId;
      return &ctx.string_state;
    }
    else if (length > 0 && str[0] == '_')
    {
      // match _label*
      if (length >= 6 && !strncmp(str, "_label", 6))
      {
        ctx.key = str;
        ctx.key_length = length;
        if (length >= 7 && ctx.key[6] == '_')
          return &ctx.label_single_property_state;
        else if (length == 6)
          return &ctx.label_state;
        else if (length == 11 && !_stricmp(str, "_labelIndex"))
          return &ctx.label_index_state;
      }
      else if (length == 10 && !strncmp(str, "_skipLearn", 10))
      {
        ctx.bool_state.output_bool = &data->skipLearn;
        return &ctx.bool_state;
      }
    }

    // ignore unknown properties
    return ctx.default_state.Ignore(ctx, length);
  }